

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 24点.cpp
# Opt level: O3

double cal_24(double a,char c,double b)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,c);
  if (iVar1 == 0x2a) {
    return a * b;
  }
  if (iVar1 != 0x2d) {
    if (iVar1 == 0x2b) {
      return a + b;
    }
    return a / b;
  }
  return a - b;
}

Assistant:

double cal_24(double a, char c,double b)
{
    if (c=='+')
    {
        return (double)a+(double)b;
    }
    if (c=='-')
    {
        return (double)a-(double)b;
    }
    if (c=='*')
    {
        return (double)a*(double)b;
    }
    if (c=='/')
    {
        return (double)a/(double)b;
    }
}